

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcheckedint_impl.h
# Opt level: O3

bool __thiscall QRect::intersects(QRect *this,QRect *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  iVar13 = (this->x1).m_i;
  iVar3 = (this->y1).m_i;
  iVar11 = iVar13 + -1;
  iVar12 = iVar3 + -1;
  iVar4 = (this->x2).m_i;
  iVar5 = (this->y2).m_i;
  if (iVar5 == iVar12 && iVar4 == iVar11) {
    return false;
  }
  iVar6 = (r->x1).m_i;
  iVar7 = (r->y1).m_i;
  iVar1 = iVar6 + -1;
  iVar2 = iVar7 + -1;
  iVar8 = (r->x2).m_i;
  iVar9 = (r->y2).m_i;
  if (iVar9 != iVar2 || iVar8 != iVar1) {
    iVar10 = iVar11;
    if (iVar11 < iVar4) {
      iVar10 = iVar4;
    }
    if (iVar4 < iVar11) {
      iVar13 = iVar4 + 1;
    }
    iVar11 = iVar1;
    if (iVar1 < iVar8) {
      iVar11 = iVar8;
    }
    if (iVar8 < iVar1) {
      iVar6 = iVar8 + 1;
    }
    if (iVar11 < iVar13) {
      return false;
    }
    if (iVar10 < iVar6) {
      return false;
    }
    if (iVar5 < iVar12) {
      iVar3 = iVar5 + 1;
    }
    iVar11 = iVar2;
    if (iVar2 < iVar9) {
      iVar11 = iVar9;
    }
    if (iVar3 <= iVar11) {
      if (iVar9 < iVar2) {
        iVar7 = iVar9 + 1;
      }
      if (iVar12 < iVar5) {
        iVar12 = iVar5;
      }
      return iVar7 <= iVar12;
    }
  }
  return false;
}

Assistant:

Q_DECLARE_STRONGLY_ORDERED_LITERAL_TYPE(
        QCheckedInt,
        AInt,
        template <typename AInt, if_is_same_int<AInt> = true>)
};

template <typename Int, typename I, typename P>
Q_DECL_CONST_FUNCTION size_t constexpr inline qHash(QCheckedInt<Int, I, P> key, size_t seed = 0) noexcept
{
    using QT_PREPEND_NAMESPACE(qHash);
    return qHash(key.value(), seed);
}